

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit.cpp
# Opt level: O2

void QDateTimeEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Data *pDVar1;
  Data DVar2;
  Data DVar3;
  Data DVar4;
  bool bVar5;
  QTime QVar6;
  time_t tVar7;
  QDate QVar8;
  QDateTime *dt;
  long in_FS_OFFSET;
  Data local_38;
  Data DStack_30;
  Data local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        dateTimeChanged((QDateTimeEdit *)_o,(QDateTime *)_a[1]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        timeChanged((QDateTimeEdit *)_o,(QTime)*_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        dateChanged((QDateTimeEdit *)_o,(QDate)*_a[1]);
        return;
      }
      break;
    case 3:
      dt = (QDateTime *)_a[1];
switchD_003c496e_caseD_0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setDateTime((QDateTimeEdit *)_o,dt);
        return;
      }
      break;
    case 4:
      QVar8.jd = *_a[1];
LAB_003c4b05:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setDate((QDateTimeEdit *)_o,QVar8);
        return;
      }
      break;
    case 5:
      QVar6.mds = *_a[1];
LAB_003c4c40:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setTime((QDateTimeEdit *)_o,QVar6);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QDateTimeEditPrivate::_q_resetButton(*(QDateTimeEditPrivate **)(_o + 8));
        return;
      }
      break;
    default:
      goto switchD_003c4910_caseD_4;
    }
    goto LAB_003c4efc;
  case ReadProperty:
    if (0x10 < (uint)_id) goto switchD_003c4910_caseD_4;
    break;
  case WriteProperty:
    if ((uint)_id < 0x11) {
      dt = (QDateTime *)*_a;
      switch(_id) {
      case 0:
        goto switchD_003c496e_caseD_0;
      case 1:
        QVar8.jd = *(qint64 *)dt;
        goto LAB_003c4b05;
      case 2:
        QVar6.mds = *(int *)dt;
        goto LAB_003c4c40;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setMaximumDateTime((QDateTimeEdit *)_o,dt);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setMinimumDateTime((QDateTimeEdit *)_o,dt);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setMaximumDate((QDateTimeEdit *)_o,(QDate)*(qint64 *)dt);
          return;
        }
        break;
      case 6:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setMinimumDate((QDateTimeEdit *)_o,(QDate)*(qint64 *)dt);
          return;
        }
        break;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setMaximumTime((QDateTimeEdit *)_o,(QTime)*(int *)dt);
          return;
        }
        break;
      case 8:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setMinimumTime((QDateTimeEdit *)_o,(QTime)*(int *)dt);
          return;
        }
        break;
      case 9:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setCurrentSection((QDateTimeEdit *)_o,*(Section *)dt);
          return;
        }
        break;
      default:
        goto switchD_003c4910_caseD_4;
      case 0xb:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDisplayFormat((QDateTimeEdit *)_o,(QString *)dt);
          return;
        }
        break;
      case 0xc:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setCalendarPopup((QDateTimeEdit *)_o,(bool)*dt);
          return;
        }
        break;
      case 0xd:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setCurrentSectionIndex((QDateTimeEdit *)_o,*(int *)dt);
          return;
        }
        break;
      case 0xf:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTimeSpec((QDateTimeEdit *)_o,*(TimeSpec *)dt);
          return;
        }
        break;
      case 0x10:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTimeZone((QDateTimeEdit *)_o,(QTimeZone *)dt);
          return;
        }
      }
      goto LAB_003c4efc;
    }
    goto switchD_003c4910_caseD_4;
  case ResetProperty:
    switch(_id) {
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clearMaximumDateTime((QDateTimeEdit *)_o);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clearMinimumDateTime((QDateTimeEdit *)_o);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clearMaximumDate((QDateTimeEdit *)_o);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clearMinimumDate((QDateTimeEdit *)_o);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clearMaximumTime((QDateTimeEdit *)_o);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clearMinimumTime((QDateTimeEdit *)_o);
        return;
      }
      break;
    default:
      goto switchD_003c4910_caseD_4;
    }
    goto LAB_003c4efc;
  default:
    goto switchD_003c4910_caseD_4;
  case IndexOfMethod:
    bVar5 = QtMocHelpers::indexOfMethod<void(QDateTimeEdit::*)(QDateTime_const&)>
                      ((QtMocHelpers *)_a,(void **)dateTimeChanged,0,0);
    if ((!bVar5) &&
       (bVar5 = QtMocHelpers::indexOfMethod<void(QDateTimeEdit::*)(QTime)>
                          ((QtMocHelpers *)_a,(void **)timeChanged,0,1), !bVar5)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QDateTimeEdit::*)(QDate)>
                  ((QtMocHelpers *)_a,(void **)dateChanged,0,2);
        return;
      }
      goto LAB_003c4efc;
    }
    goto switchD_003c4910_caseD_4;
  }
  pDVar1 = (Data *)*_a;
  switch(_id) {
  case 0:
    dateTime((QDateTimeEdit *)&local_38.s);
    goto LAB_003c4e80;
  case 1:
    QVar8 = date((QDateTimeEdit *)_o);
    goto LAB_003c4ec8;
  case 2:
    tVar7 = time((QDateTimeEdit *)_o,(time_t *)&switchD_003c4910::switchdataD_00658f44);
    QVar6.mds = (int)tVar7;
    break;
  case 3:
    maximumDateTime((QDateTimeEdit *)&local_38.s);
    goto LAB_003c4e80;
  case 4:
    minimumDateTime((QDateTimeEdit *)&local_38.s);
LAB_003c4e80:
    DVar2.s = *(ShortData *)pDVar1;
    *pDVar1 = local_38;
    local_38.s = DVar2.s;
    QDateTime::~QDateTime((QDateTime *)&local_38.s);
    goto switchD_003c4910_caseD_4;
  case 5:
    QVar8 = maximumDate((QDateTimeEdit *)_o);
    goto LAB_003c4ec8;
  case 6:
    QVar8 = minimumDate((QDateTimeEdit *)_o);
LAB_003c4ec8:
    pDVar1->s = (ShortData)QVar8.jd;
    goto switchD_003c4910_caseD_4;
  case 7:
    QVar6 = maximumTime((QDateTimeEdit *)_o);
    break;
  case 8:
    QVar6 = minimumTime((QDateTimeEdit *)_o);
    break;
  case 9:
    QVar6.mds = currentSection((QDateTimeEdit *)_o);
    break;
  case 10:
    QVar6.mds = *(Section *)(*(long *)(_o + 8) + 0x470);
    break;
  case 0xb:
    displayFormat((QString *)&local_38.s,(QDateTimeEdit *)_o);
    DVar3.s = *(ShortData *)pDVar1;
    DVar4 = pDVar1[1];
    *pDVar1 = local_38;
    pDVar1[1] = DStack_30;
    DVar2 = pDVar1[2];
    pDVar1[2] = local_28;
    local_38.s = DVar3.s;
    DStack_30 = DVar4;
    local_28 = DVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38.s);
    goto switchD_003c4910_caseD_4;
  case 0xc:
    *(undefined1 *)pDVar1 = *(undefined1 *)(*(long *)(_o + 8) + 0x4fa);
    goto switchD_003c4910_caseD_4;
  case 0xd:
    QVar6.mds = *(Section *)(*(long *)(_o + 8) + 0x3e0);
    break;
  case 0xe:
    QVar6.mds = *(Section *)(*(long *)(_o + 8) + 0x418);
    break;
  case 0xf:
    QVar6.mds = *(int *)(*(long *)(_o + 8) + 0x508) - AmPmSection & (MSecSection|AmPmSection);
    break;
  case 0x10:
    timeZone((QDateTimeEdit *)&local_38.s);
    DVar2.s = *(ShortData *)pDVar1;
    *pDVar1 = local_38;
    local_38.s = DVar2.s;
    QTimeZone::~QTimeZone((QTimeZone *)&local_38.s);
    goto switchD_003c4910_caseD_4;
  }
  *(int *)pDVar1 = QVar6.mds;
switchD_003c4910_caseD_4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003c4efc:
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDateTimeEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dateTimeChanged((*reinterpret_cast< std::add_pointer_t<QDateTime>>(_a[1]))); break;
        case 1: _t->timeChanged((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        case 2: _t->dateChanged((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->setDateTime((*reinterpret_cast< std::add_pointer_t<QDateTime>>(_a[1]))); break;
        case 4: _t->setDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->setTime((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        case 6: _t->d_func()->_q_resetButton(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDateTimeEdit::*)(const QDateTime & )>(_a, &QDateTimeEdit::dateTimeChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDateTimeEdit::*)(QTime )>(_a, &QDateTimeEdit::timeChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDateTimeEdit::*)(QDate )>(_a, &QDateTimeEdit::dateChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QDateTime*>(_v) = _t->dateTime(); break;
        case 1: *reinterpret_cast<QDate*>(_v) = _t->date(); break;
        case 2: *reinterpret_cast<QTime*>(_v) = _t->time(); break;
        case 3: *reinterpret_cast<QDateTime*>(_v) = _t->maximumDateTime(); break;
        case 4: *reinterpret_cast<QDateTime*>(_v) = _t->minimumDateTime(); break;
        case 5: *reinterpret_cast<QDate*>(_v) = _t->maximumDate(); break;
        case 6: *reinterpret_cast<QDate*>(_v) = _t->minimumDate(); break;
        case 7: *reinterpret_cast<QTime*>(_v) = _t->maximumTime(); break;
        case 8: *reinterpret_cast<QTime*>(_v) = _t->minimumTime(); break;
        case 9: *reinterpret_cast<Section*>(_v) = _t->currentSection(); break;
        case 10: QtMocHelpers::assignFlags<Sections>(_v, _t->displayedSections()); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->displayFormat(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->calendarPopup(); break;
        case 13: *reinterpret_cast<int*>(_v) = _t->currentSectionIndex(); break;
        case 14: *reinterpret_cast<int*>(_v) = _t->sectionCount(); break;
        case 15: *reinterpret_cast<Qt::TimeSpec*>(_v) = _t->timeSpec(); break;
        case 16: *reinterpret_cast<QTimeZone*>(_v) = _t->timeZone(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDateTime(*reinterpret_cast<QDateTime*>(_v)); break;
        case 1: _t->setDate(*reinterpret_cast<QDate*>(_v)); break;
        case 2: _t->setTime(*reinterpret_cast<QTime*>(_v)); break;
        case 3: _t->setMaximumDateTime(*reinterpret_cast<QDateTime*>(_v)); break;
        case 4: _t->setMinimumDateTime(*reinterpret_cast<QDateTime*>(_v)); break;
        case 5: _t->setMaximumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 6: _t->setMinimumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 7: _t->setMaximumTime(*reinterpret_cast<QTime*>(_v)); break;
        case 8: _t->setMinimumTime(*reinterpret_cast<QTime*>(_v)); break;
        case 9: _t->setCurrentSection(*reinterpret_cast<Section*>(_v)); break;
        case 11: _t->setDisplayFormat(*reinterpret_cast<QString*>(_v)); break;
        case 12: _t->setCalendarPopup(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setCurrentSectionIndex(*reinterpret_cast<int*>(_v)); break;
        case 15: _t->setTimeSpec(*reinterpret_cast<Qt::TimeSpec*>(_v)); break;
        case 16: _t->setTimeZone(*reinterpret_cast<QTimeZone*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 3: _t->clearMaximumDateTime(); break;
        case 4: _t->clearMinimumDateTime(); break;
        case 5: _t->clearMaximumDate(); break;
        case 6: _t->clearMinimumDate(); break;
        case 7: _t->clearMaximumTime(); break;
        case 8: _t->clearMinimumTime(); break;
        default: break;
        }
    }
}